

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec2 vec2_rotate(vec2 v,float theta)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uStack_18;
  float theta_local;
  vec2 v_local;
  vec2 u;
  
  uStack_18 = v.x;
  fVar2 = cosf(theta);
  theta_local = v.y;
  fVar3 = sinf(theta);
  fVar4 = cosf(theta);
  fVar5 = sinf(theta);
  vVar1.y = theta_local * fVar4 + uStack_18 * fVar5;
  vVar1.x = uStack_18 * fVar2 - theta_local * fVar3;
  return vVar1;
}

Assistant:

vec2 vec2_rotate(vec2 v, float theta) {
    vec2 u;
    u.x = v.x * cosf(theta) - v.y * sinf(theta);
    u.y = v.y * cosf(theta) + v.x * sinf(theta);
    return u;
}